

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void __thiscall DACSThinker::DumpScriptStatus(DACSThinker *this)

{
  char *pcVar1;
  FString local_20;
  DLevelScript *local_18;
  DLevelScript *script;
  DACSThinker *this_local;
  
  script = (DLevelScript *)this;
  for (local_18 = this->Scripts; local_18 != (DLevelScript *)0x0; local_18 = local_18->next) {
    ScriptPresentation((int)&local_20);
    pcVar1 = FString::GetChars(&local_20);
    Printf("%s: %s\n",pcVar1,DumpScriptStatus::stateNames[local_18->state]);
    FString::~FString(&local_20);
  }
  return;
}

Assistant:

void DACSThinker::DumpScriptStatus ()
{
	static const char *stateNames[] =
	{
		"Running",
		"Suspended",
		"Delayed",
		"TagWait",
		"PolyWait",
		"ScriptWaitPre",
		"ScriptWait",
		"PleaseRemove"
	};
	DLevelScript *script = Scripts;

	while (script != NULL)
	{
		Printf("%s: %s\n", ScriptPresentation(script->script).GetChars(), stateNames[script->state]);
		script = script->next;
	}
}